

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O3

int kex_method_ecdh_key_exchange(LIBSSH2_SESSION *session,key_exchange_state_low_t *key_state)

{
  int iVar1;
  size_t data_len;
  char *errmsg;
  libssh2_curve_type type;
  uchar *s;
  
  iVar1 = 0;
  switch(key_state->state) {
  case libssh2_NB_state_idle:
    break;
  default:
    goto switchD_00115fe4_caseD_1;
  case libssh2_NB_state_created:
    goto switchD_00115fe4_caseD_2;
  case libssh2_NB_state_sent:
    data_len = key_state->request_len;
    goto LAB_00116094;
  case libssh2_NB_state_sent1:
    goto switchD_00115fe4_caseD_4;
  case libssh2_NB_state_sent2:
    goto switchD_00115fe4_caseD_5;
  }
  key_state->public_key_oct = (uchar *)0x0;
  key_state->state = libssh2_NB_state_created;
switchD_00115fe4_caseD_2:
  iVar1 = kex_session_ecdh_curve_type(session->kex->name,&type);
  if (iVar1 == 0) {
    iVar1 = _libssh2_ecdsa_create_key
                      (session,&key_state->private_key,&key_state->public_key_oct,
                       &key_state->public_key_oct_len,type);
    if (iVar1 == 0) {
      key_state->request[0] = '\x1e';
      s = key_state->request + 1;
      _libssh2_store_str(&s,(char *)key_state->public_key_oct,key_state->public_key_oct_len);
      data_len = key_state->public_key_oct_len + 5;
      key_state->request_len = data_len;
      key_state->state = libssh2_NB_state_sent;
LAB_00116094:
      iVar1 = _libssh2_transport_send(session,key_state->request,data_len,(uchar *)0x0,0);
      if (iVar1 == -0x25) {
        return -0x25;
      }
      if (iVar1 == 0) {
        key_state->state = libssh2_NB_state_sent1;
switchD_00115fe4_caseD_4:
        iVar1 = _libssh2_packet_require
                          (session,'\x1f',&key_state->data,&key_state->data_len,0,(uchar *)0x0,0,
                           &key_state->req_state);
        if (iVar1 == -0x25) {
          return -0x25;
        }
        if (iVar1 == 0) {
          key_state->state = libssh2_NB_state_sent2;
switchD_00115fe4_caseD_5:
          iVar1 = kex_session_ecdh_curve_type(session->kex->name,&type);
          if (iVar1 == 0) {
            iVar1 = ecdh_sha2_nistp(session,type,key_state->data,key_state->data_len,
                                    key_state->public_key_oct,key_state->public_key_oct_len,
                                    key_state->private_key,&key_state->exchange_state);
            if (iVar1 == -0x25) {
              return -0x25;
            }
            (*session->free)(key_state->data,&session->abstract);
            goto switchD_00115fe4_caseD_1;
          }
          goto LAB_0011611e;
        }
        errmsg = "Timeout waiting for ECDH_REPLY reply";
      }
      else {
        errmsg = "Unable to send ECDH_INIT";
      }
    }
    else {
      errmsg = "Unable to create private key";
    }
  }
  else {
LAB_0011611e:
    errmsg = "Unknown KEX nistp curve type";
    iVar1 = -1;
  }
  iVar1 = _libssh2_error(session,iVar1,errmsg);
switchD_00115fe4_caseD_1:
  if (key_state->public_key_oct != (uchar *)0x0) {
    (*session->free)(key_state->public_key_oct,&session->abstract);
    key_state->public_key_oct = (uchar *)0x0;
  }
  if ((EVP_PKEY *)key_state->private_key != (EVP_PKEY *)0x0) {
    EVP_PKEY_free((EVP_PKEY *)key_state->private_key);
    key_state->private_key = (EVP_PKEY *)0x0;
  }
  key_state->state = libssh2_NB_state_idle;
  return iVar1;
}

Assistant:

static int
kex_method_ecdh_key_exchange
(LIBSSH2_SESSION * session, key_exchange_state_low_t * key_state)
{
    int ret = 0;
    int rc = 0;
    unsigned char *s;
    libssh2_curve_type type;

    if(key_state->state == libssh2_NB_state_idle) {

        key_state->public_key_oct = NULL;
        key_state->state = libssh2_NB_state_created;
    }

    if(key_state->state == libssh2_NB_state_created) {
        rc = kex_session_ecdh_curve_type(session->kex->name, &type);

        if(rc) {
            ret = _libssh2_error(session, -1,
                                 "Unknown KEX nistp curve type");
            goto ecdh_clean_exit;
        }

        rc = _libssh2_ecdsa_create_key(session, &key_state->private_key,
                                       &key_state->public_key_oct,
                                       &key_state->public_key_oct_len, type);

        if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to create private key");
            goto ecdh_clean_exit;
        }

        key_state->request[0] = SSH2_MSG_KEX_ECDH_INIT;
        s = key_state->request + 1;
        _libssh2_store_str(&s, (const char *)key_state->public_key_oct,
                           key_state->public_key_oct_len);
        key_state->request_len = key_state->public_key_oct_len + 5;

        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Initiating ECDH SHA2 NISTP256"));

        key_state->state = libssh2_NB_state_sent;
    }

    if(key_state->state == libssh2_NB_state_sent) {
        rc = _libssh2_transport_send(session, key_state->request,
                                     key_state->request_len, NULL, 0);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to send ECDH_INIT");
            goto ecdh_clean_exit;
        }

        key_state->state = libssh2_NB_state_sent1;
    }

    if(key_state->state == libssh2_NB_state_sent1) {
        rc = _libssh2_packet_require(session, SSH2_MSG_KEX_ECDH_REPLY,
                                     &key_state->data, &key_state->data_len,
                                     0, NULL, 0, &key_state->req_state);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Timeout waiting for ECDH_REPLY reply");
            goto ecdh_clean_exit;
        }

        key_state->state = libssh2_NB_state_sent2;
    }

    if(key_state->state == libssh2_NB_state_sent2) {

        rc = kex_session_ecdh_curve_type(session->kex->name, &type);

        if(rc) {
            ret = _libssh2_error(session, -1,
                                 "Unknown KEX nistp curve type");
            goto ecdh_clean_exit;
        }

        ret = ecdh_sha2_nistp(session, type, key_state->data,
                              key_state->data_len,
                              (unsigned char *)key_state->public_key_oct,
                              key_state->public_key_oct_len,
                              key_state->private_key,
                              &key_state->exchange_state);

        if(ret == LIBSSH2_ERROR_EAGAIN) {
            return ret;
        }

        LIBSSH2_FREE(session, key_state->data);
    }

ecdh_clean_exit:

    if(key_state->public_key_oct) {
        LIBSSH2_FREE(session, key_state->public_key_oct);
        key_state->public_key_oct = NULL;
    }

    if(key_state->private_key) {
        _libssh2_ecdsa_free(key_state->private_key);
        key_state->private_key = NULL;
    }

    key_state->state = libssh2_NB_state_idle;

    return ret;
}